

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O2

void anon_unknown.dwarf_b4f9::fillChannels(Rand48 *random,FlatImageLevel *level)

{
  int iVar1;
  long lVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  long lVar7;
  uint16_t *puVar8;
  float *pfVar9;
  undefined4 *puVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  half local_42;
  FlatImageLevel *local_40;
  _Rb_tree_node_base *local_38;
  
  local_40 = level;
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::begin();
  do {
    p_Var5 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::end();
    if (p_Var4 == p_Var5) {
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"             channel ");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var4 + 1));
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar3 = (**(code **)**(undefined8 **)(p_Var4 + 2))();
    local_38 = p_Var4;
    if (iVar3 == 0) {
      lVar7 = __dynamic_cast(*(undefined8 *)(p_Var4 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                             &Imf_3_4::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
      if (lVar7 == 0) goto LAB_0010847c;
      lVar2 = *(long *)(lVar7 + 8);
      iVar3 = *(int *)(lVar7 + 0x10);
      iVar1 = *(int *)(lVar7 + 0x14);
      for (iVar12 = *(int *)(lVar2 + 0x1c); iVar12 <= *(int *)(lVar2 + 0x24);
          iVar12 = iVar12 + iVar1) {
        for (iVar11 = *(int *)(lVar2 + 0x18); iVar11 <= *(int *)(lVar2 + 0x20);
            iVar11 = iVar11 + iVar3) {
          dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
          puVar10 = (undefined4 *)
                    Imf_3_4::TypedFlatImageChannel<unsigned_int>::at((int)lVar7,iVar11);
          *puVar10 = (int)(long)dVar13;
        }
      }
    }
    else if (iVar3 == 2) {
      lVar7 = __dynamic_cast(*(undefined8 *)(p_Var4 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                             &Imf_3_4::TypedFlatImageChannel<float>::typeinfo,0);
      if (lVar7 == 0) goto LAB_0010847c;
      lVar2 = *(long *)(lVar7 + 8);
      iVar3 = *(int *)(lVar7 + 0x10);
      iVar1 = *(int *)(lVar7 + 0x14);
      for (iVar12 = *(int *)(lVar2 + 0x1c); iVar12 <= *(int *)(lVar2 + 0x24);
          iVar12 = iVar12 + iVar1) {
        for (iVar11 = *(int *)(lVar2 + 0x18); iVar11 <= *(int *)(lVar2 + 0x20);
            iVar11 = iVar11 + iVar3) {
          dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
          pfVar9 = (float *)Imf_3_4::TypedFlatImageChannel<float>::at((int)lVar7,iVar11);
          *pfVar9 = (float)dVar13;
        }
      }
    }
    else {
      if (iVar3 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                      ,0xc9,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImageLevel &)");
      }
      lVar7 = __dynamic_cast(*(undefined8 *)(p_Var4 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                             &Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
      if (lVar7 == 0) {
LAB_0010847c:
        __cxa_bad_cast();
      }
      lVar2 = *(long *)(lVar7 + 8);
      iVar3 = *(int *)(lVar7 + 0x10);
      iVar1 = *(int *)(lVar7 + 0x14);
      for (iVar12 = *(int *)(lVar2 + 0x1c); iVar12 <= *(int *)(lVar2 + 0x24);
          iVar12 = iVar12 + iVar1) {
        for (iVar11 = *(int *)(lVar2 + 0x18); iVar11 <= *(int *)(lVar2 + 0x20);
            iVar11 = iVar11 + iVar3) {
          dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
          Imath_3_2::half::half(&local_42,(float)dVar13);
          puVar8 = (uint16_t *)
                   Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::at((int)lVar7,iVar11);
          *puVar8 = local_42._h;
        }
      }
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, FlatImageLevel& level)
{
    for (FlatImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}